

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O0

int pzshape::TPZShapePiramHdiv::NConnectShapeF(int side,int order)

{
  int iVar1;
  uint in_EDI;
  int in_stack_ffffffffffffffec;
  
  if (3 < in_EDI) {
    if (in_EDI == 4) {
      return 0;
    }
    if ((3 < in_EDI - 5) && (in_EDI != 0xd)) {
      iVar1 = TPZShapePiram::NConnectShapeF(in_EDI,in_stack_ffffffffffffffec);
      return iVar1;
    }
  }
  iVar1 = TPZShapePiram::NConnectShapeF(in_EDI,in_stack_ffffffffffffffec);
  return iVar1 << 1;
}

Assistant:

int TPZShapePiramHdiv::NConnectShapeF(int side, int order) {
        switch (side) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 5:
            case 6:
            case 7:
            case 8:
            case 13:
                
                return TPZShapePiram::NConnectShapeF(side, order)*2;
                break;
            case 4:
                return 0;
                break;
            default:
                return TPZShapePiram::NConnectShapeF(side, order);
                break;
        }
    }